

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O3

Vector2f __thiscall Rml::Box::GetPosition(Box *this,BoxArea area)

{
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  ulong uVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  
  uVar4 = (ulong)area;
  if (area == Auto) {
    bVar3 = Assert("RMLUI_ASSERT(area != BoxArea::Auto)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Box.cpp"
                   ,0x29);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    fVar6 = -this->area_edges[0][3];
    fVar7 = -this->area_edges[0][0];
  }
  else {
    fVar6 = -this->area_edges[0][3];
    fVar7 = -this->area_edges[0][0];
    if ((int)area < 1) goto LAB_001e3a79;
  }
  pfVar5 = this->area_edges[0] + 3;
  do {
    fVar6 = fVar6 + *pfVar5;
    fVar7 = fVar7 + (*(float (*) [4])(pfVar5 + -3))[0];
    pfVar5 = pfVar5 + 4;
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
LAB_001e3a79:
  VVar2.y = fVar7;
  VVar2.x = fVar6;
  return VVar2;
}

Assistant:

Vector2f Box::GetPosition(BoxArea area) const
{
	RMLUI_ASSERT(area != BoxArea::Auto);
	Vector2f area_position(-GetEdge(BoxArea::Margin, BoxEdge::Left), -GetEdge(BoxArea::Margin, BoxEdge::Top));
	for (int i = 0; i < (int)area; i++)
	{
		area_position.x += area_edges[i][(int)BoxEdge::Left];
		area_position.y += area_edges[i][(int)BoxEdge::Top];
	}

	return area_position;
}